

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2builder.cc
# Opt level: O1

void __thiscall S2Builder::ChooseInitialSites(S2Builder *this,S2PointIndex<int> *site_index)

{
  _Head_base<0UL,_Vector3<double>,_false> *p_Var1;
  pointer *ppVVar2;
  S2Point *point;
  double *pdVar3;
  double dVar4;
  pointer pVVar5;
  iterator __position;
  pointer pRVar6;
  int iVar7;
  long lVar8;
  Result *result;
  pointer pRVar9;
  InputVertexKey *key;
  pointer ppVar10;
  bool bVar11;
  const_iterator cVar12;
  S2Point site;
  vector<S2ClosestPointQueryBase<S2MinDistance,_int>::Result,_std::allocator<S2ClosestPointQueryBase<S2MinDistance,_int>::Result>_>
  results;
  S2ClosestPointQueryPointTarget target;
  S2Point local_4a0;
  vector<S2ClosestPointQueryBase<S2MinDistance,_int>::Result,_std::allocator<S2ClosestPointQueryBase<S2MinDistance,_int>::Result>_>
  local_488;
  vector<Vector3<double>,std::allocator<Vector3<double>>> *local_468;
  S2PointIndex<int> *local_460;
  _func_int **local_458;
  undefined **local_450;
  pointer local_448;
  vector<std::pair<S2CellId,_int>,_std::allocator<std::pair<S2CellId,_int>_>_> local_440;
  Target local_428;
  double local_420;
  VType VStack_418;
  VType local_410;
  PointData local_408;
  S2ClosestPointQueryOptions local_3e8;
  Options local_3c8;
  S2ClosestPointQueryBase<S2MinDistance,_int> local_3a8;
  
  S1ChordAngle::S1ChordAngle((S1ChordAngle *)&local_3e8,INFINITY);
  S1ChordAngle::S1ChordAngle((S1ChordAngle *)&local_3c8,0.0);
  local_3e8.super_S2ClosestPointQueryBaseOptions<S2MinDistance>.max_error_.length2_._0_5_ =
       local_3c8.max_distance_.super_S1ChordAngle.length2_._0_5_;
  local_3e8.super_S2ClosestPointQueryBaseOptions<S2MinDistance>.max_error_.length2_._5_3_ =
       local_3c8.max_distance_.super_S1ChordAngle.length2_._5_3_;
  local_3e8.super_S2ClosestPointQueryBaseOptions<S2MinDistance>.region_._0_5_ = 0;
  local_3e8.super_S2ClosestPointQueryBaseOptions<S2MinDistance>.region_._5_3_ = 0;
  local_3e8.super_S2ClosestPointQueryBaseOptions<S2MinDistance>.max_results_ = 0x7fffffff;
  local_3e8.super_S2ClosestPointQueryBaseOptions<S2MinDistance>.use_brute_force_ = false;
  S2ClosestPointQueryOptions::set_conservative_max_distance
            (&local_3e8,(S1ChordAngle)(this->min_site_separation_ca_).length2_);
  S1ChordAngle::S1ChordAngle((S1ChordAngle *)&local_3c8,INFINITY);
  S1ChordAngle::S1ChordAngle((S1ChordAngle *)&local_408,0.0);
  local_3c8.max_error_.length2_._0_5_ =
       (undefined5)
       CONCAT44(local_408.tuple_.super__Tuple_impl<0UL,_Vector3<double>,_int>._4_4_,
                local_408.tuple_.super__Tuple_impl<0UL,_Vector3<double>,_int>.
                super__Tuple_impl<1UL,_int>.super__Head_base<1UL,_int,_false>._M_head_impl);
  local_3c8.max_error_.length2_._5_3_ =
       local_408.tuple_.super__Tuple_impl<0UL,_Vector3<double>,_int>._5_3_;
  local_3c8.region_._0_5_ = 0;
  local_3c8.region_._5_3_ = 0;
  local_3c8.max_results_ = 0x7fffffff;
  local_3c8.use_brute_force_ = false;
  S2ClosestPointQueryBase<S2MinDistance,_int>::S2ClosestPointQueryBase(&local_3a8);
  local_3c8.region_._0_5_ =
       local_3e8.super_S2ClosestPointQueryBaseOptions<S2MinDistance>.region_._0_5_;
  local_3c8.region_._5_3_ =
       local_3e8.super_S2ClosestPointQueryBaseOptions<S2MinDistance>.region_._5_3_;
  local_3c8.max_results_ =
       local_3e8.super_S2ClosestPointQueryBaseOptions<S2MinDistance>.max_results_;
  local_3c8.use_brute_force_ =
       local_3e8.super_S2ClosestPointQueryBaseOptions<S2MinDistance>.use_brute_force_;
  local_3c8.max_distance_.super_S1ChordAngle.length2_ =
       local_3e8.super_S2ClosestPointQueryBaseOptions<S2MinDistance>.max_distance_.
       super_S1ChordAngle.length2_;
  local_3c8.max_error_.length2_._0_5_ =
       local_3e8.super_S2ClosestPointQueryBaseOptions<S2MinDistance>.max_error_.length2_._0_5_;
  local_3c8.max_error_.length2_._5_3_ =
       local_3e8.super_S2ClosestPointQueryBaseOptions<S2MinDistance>.max_error_.length2_._5_3_;
  local_460 = site_index;
  local_3a8.index_ = site_index;
  local_3a8.iter_.map_ = &site_index->map_;
  local_3a8.iter_.iter_.node =
       gtl::internal_btree::
       btree<gtl::internal_btree::map_params<S2CellId,_S2PointIndex<int>::PointData,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2PointIndex<int>::PointData>_>,_256,_true>_>
       ::leftmost((btree<gtl::internal_btree::map_params<S2CellId,_S2PointIndex<int>::PointData,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2PointIndex<int>::PointData>_>,_256,_true>_>
                   *)site_index);
  local_3a8.iter_.iter_.position = 0;
  cVar12 = gtl::internal_btree::
           btree<gtl::internal_btree::map_params<S2CellId,_S2PointIndex<int>::PointData,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2PointIndex<int>::PointData>_>,_256,_true>_>
           ::end((btree<gtl::internal_btree::map_params<S2CellId,_S2PointIndex<int>::PointData,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2PointIndex<int>::PointData>_>,_256,_true>_>
                  *)local_3a8.iter_.map_);
  local_3a8.iter_.end_.node = cVar12.node;
  local_3a8.iter_.end_.position = cVar12.position;
  if (local_3a8.index_covering_.super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_3a8.index_covering_.super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.
      super__Vector_impl_data._M_start) {
    local_3a8.index_covering_.super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_3a8.index_covering_.super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.
         super__Vector_impl_data._M_start;
  }
  local_488.
  super__Vector_base<S2ClosestPointQueryBase<S2MinDistance,_int>::Result,_std::allocator<S2ClosestPointQueryBase<S2MinDistance,_int>::Result>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_488.
  super__Vector_base<S2ClosestPointQueryBase<S2MinDistance,_int>::Result,_std::allocator<S2ClosestPointQueryBase<S2MinDistance,_int>::Result>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_488.
  super__Vector_base<S2ClosestPointQueryBase<S2MinDistance,_int>::Result,_std::allocator<S2ClosestPointQueryBase<S2MinDistance,_int>::Result>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  SortInputVertices(&local_440,this);
  local_448 = local_440.
              super__Vector_base<std::pair<S2CellId,_int>,_std::allocator<std::pair<S2CellId,_int>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  if (local_440.
      super__Vector_base<std::pair<S2CellId,_int>,_std::allocator<std::pair<S2CellId,_int>_>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      local_440.
      super__Vector_base<std::pair<S2CellId,_int>,_std::allocator<std::pair<S2CellId,_int>_>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    local_468 = (vector<Vector3<double>,std::allocator<Vector3<double>>> *)&this->sites_;
    local_450 = &PTR__S2DistanceTarget_002c29a0;
    local_458 = (_func_int **)&PTR__S2DistanceTarget_002c1c98;
    ppVar10 = local_440.
              super__Vector_base<std::pair<S2CellId,_int>,_std::allocator<std::pair<S2CellId,_int>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      iVar7 = ppVar10->second;
      pVVar5 = (this->input_vertices_).
               super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>._M_impl.
               super__Vector_impl_data._M_start;
      point = pVVar5 + iVar7;
      SnapSite(&local_4a0,this,point);
      bVar11 = true;
      if (((this->snapping_needed_ == false) && (local_4a0.c_[0] == point->c_[0])) &&
         (!NAN(local_4a0.c_[0]) && !NAN(point->c_[0]))) {
        lVar8 = 0;
        do {
          bVar11 = lVar8 == 0x10;
          if (bVar11) goto LAB_001ac5af;
          dVar4 = *(double *)((long)local_4a0.c_ + lVar8 + 8);
          pdVar3 = (double *)((long)pVVar5[iVar7].c_ + lVar8 + 8);
          lVar8 = lVar8 + 8;
        } while ((dVar4 == *pdVar3) && (!NAN(dVar4) && !NAN(*pdVar3)));
        bVar11 = false;
LAB_001ac5af:
        bVar11 = (bool)(bVar11 ^ 1);
      }
      this->snapping_needed_ = bVar11;
      local_410 = local_4a0.c_[2];
      local_420 = local_4a0.c_[0];
      VStack_418 = local_4a0.c_[1];
      local_428._vptr_S2DistanceTarget = local_458;
      S2ClosestPointQueryBase<S2MinDistance,_int>::FindClosestPoints
                (&local_3a8,&local_428,&local_3c8,&local_488);
      pRVar6 = local_488.
               super__Vector_base<S2ClosestPointQueryBase<S2MinDistance,_int>::Result,_std::allocator<S2ClosestPointQueryBase<S2MinDistance,_int>::Result>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (local_488.
          super__Vector_base<S2ClosestPointQueryBase<S2MinDistance,_int>::Result,_std::allocator<S2ClosestPointQueryBase<S2MinDistance,_int>::Result>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          local_488.
          super__Vector_base<S2ClosestPointQueryBase<S2MinDistance,_int>::Result,_std::allocator<S2ClosestPointQueryBase<S2MinDistance,_int>::Result>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
LAB_001ac68e:
        local_408.tuple_.super__Tuple_impl<0UL,_Vector3<double>,_int>.super__Tuple_impl<1UL,_int>.
        super__Head_base<1UL,_int,_false>._M_head_impl =
             (_Head_base<1UL,_int,_false>)
             ((int)((ulong)((long)(this->sites_).
                                  super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(this->sites_).
                                 super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x55555555);
        local_408.tuple_.super__Tuple_impl<0UL,_Vector3<double>,_int>.
        super__Head_base<0UL,_Vector3<double>,_false>._M_head_impl.c_[2] = local_4a0.c_[2];
        local_408.tuple_.super__Tuple_impl<0UL,_Vector3<double>,_int>.
        super__Head_base<0UL,_Vector3<double>,_false>._M_head_impl.c_[0] = local_4a0.c_[0];
        local_408.tuple_.super__Tuple_impl<0UL,_Vector3<double>,_int>.
        super__Head_base<0UL,_Vector3<double>,_false>._M_head_impl.c_[1] = local_4a0.c_[1];
        S2PointIndex<int>::Add(local_460,&local_408);
        __position._M_current =
             (this->sites_).super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (this->sites_).super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<Vector3<double>,std::allocator<Vector3<double>>>::
          _M_realloc_insert<Vector3<double>const&>(local_468,__position,&local_4a0);
        }
        else {
          (__position._M_current)->c_[2] = local_4a0.c_[2];
          (__position._M_current)->c_[0] = local_4a0.c_[0];
          (__position._M_current)->c_[1] = local_4a0.c_[1];
          ppVVar2 = &(this->sites_).
                     super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>._M_impl.
                     super__Vector_impl_data._M_finish;
          *ppVVar2 = *ppVVar2 + 1;
        }
        local_3a8.iter_.map_ = &(local_3a8.index_)->map_;
        local_3a8.iter_.iter_.node =
             gtl::internal_btree::
             btree<gtl::internal_btree::map_params<S2CellId,_S2PointIndex<int>::PointData,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2PointIndex<int>::PointData>_>,_256,_true>_>
             ::leftmost((btree<gtl::internal_btree::map_params<S2CellId,_S2PointIndex<int>::PointData,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2PointIndex<int>::PointData>_>,_256,_true>_>
                         *)local_3a8.index_);
        local_3a8.iter_.iter_.position = 0;
        cVar12 = gtl::internal_btree::
                 btree<gtl::internal_btree::map_params<S2CellId,_S2PointIndex<int>::PointData,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2PointIndex<int>::PointData>_>,_256,_true>_>
                 ::end((btree<gtl::internal_btree::map_params<S2CellId,_S2PointIndex<int>::PointData,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2PointIndex<int>::PointData>_>,_256,_true>_>
                        *)local_3a8.iter_.map_);
        local_3a8.iter_.end_.node = cVar12.node;
        local_3a8.iter_.end_.position = cVar12.position;
        if (local_3a8.index_covering_.super__Vector_base<S2CellId,_std::allocator<S2CellId>_>.
            _M_impl.super__Vector_impl_data._M_finish !=
            local_3a8.index_covering_.super__Vector_base<S2CellId,_std::allocator<S2CellId>_>.
            _M_impl.super__Vector_impl_data._M_start) {
          local_3a8.index_covering_.super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_3a8.index_covering_.super__Vector_base<S2CellId,_std::allocator<S2CellId>_>.
               _M_impl.super__Vector_impl_data._M_start;
        }
      }
      else {
        bVar11 = true;
        pRVar9 = local_488.
                 super__Vector_base<S2ClosestPointQueryBase<S2MinDistance,_int>::Result,_std::allocator<S2ClosestPointQueryBase<S2MinDistance,_int>::Result>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        do {
          iVar7 = s2pred::CompareDistance
                            (&local_4a0,
                             &(pRVar9->point_data_->tuple_).
                              super__Tuple_impl<0UL,_Vector3<double>,_int>.
                              super__Head_base<0UL,_Vector3<double>,_false>._M_head_impl,
                             (S1ChordAngle)(this->min_site_separation_ca_).length2_);
          if (iVar7 < 1) {
            bVar11 = true;
            if (this->snapping_needed_ == false) {
              p_Var1 = &(pRVar9->point_data_->tuple_).super__Tuple_impl<0UL,_Vector3<double>,_int>.
                        super__Head_base<0UL,_Vector3<double>,_false>;
              if ((local_4a0.c_[0] == (p_Var1->_M_head_impl).c_[0]) &&
                 (!NAN(local_4a0.c_[0]) && !NAN((p_Var1->_M_head_impl).c_[0]))) {
                lVar8 = 0;
                do {
                  bVar11 = lVar8 == 0x10;
                  if (bVar11) goto LAB_001ac674;
                  dVar4 = *(double *)((long)local_4a0.c_ + lVar8 + 8);
                  pdVar3 = (double *)
                           ((long)(pRVar9->point_data_->tuple_).
                                  super__Tuple_impl<0UL,_Vector3<double>,_int>.
                                  super__Head_base<0UL,_Vector3<double>,_false>._M_head_impl.c_ +
                           lVar8 + 8);
                  lVar8 = lVar8 + 8;
                } while ((dVar4 == *pdVar3) && (!NAN(dVar4) && !NAN(*pdVar3)));
                bVar11 = false;
LAB_001ac674:
                bVar11 = (bool)(bVar11 ^ 1);
              }
            }
            this->snapping_needed_ = bVar11;
            bVar11 = false;
          }
          pRVar9 = pRVar9 + 1;
        } while (pRVar9 != pRVar6);
        if (bVar11) goto LAB_001ac68e;
      }
      ppVar10 = ppVar10 + 1;
    } while (ppVar10 != local_448);
  }
  if (local_440.
      super__Vector_base<std::pair<S2CellId,_int>,_std::allocator<std::pair<S2CellId,_int>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_440.
                    super__Vector_base<std::pair<S2CellId,_int>,_std::allocator<std::pair<S2CellId,_int>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_488.
      super__Vector_base<S2ClosestPointQueryBase<S2MinDistance,_int>::Result,_std::allocator<S2ClosestPointQueryBase<S2MinDistance,_int>::Result>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_488.
                    super__Vector_base<S2ClosestPointQueryBase<S2MinDistance,_int>::Result,_std::allocator<S2ClosestPointQueryBase<S2MinDistance,_int>::Result>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  S2ClosestPointQueryBase<S2MinDistance,_int>::~S2ClosestPointQueryBase(&local_3a8);
  return;
}

Assistant:

void S2Builder::ChooseInitialSites(S2PointIndex<SiteId>* site_index) {
  // Find all points whose distance is <= min_site_separation_ca_.
  S2ClosestPointQueryOptions options;
  options.set_conservative_max_distance(min_site_separation_ca_);
  S2ClosestPointQuery<SiteId> site_query(site_index, options);
  vector<S2ClosestPointQuery<SiteId>::Result> results;

  // Apply the snap_function() to each input vertex, then check whether any
  // existing site is closer than min_vertex_separation().  If not, then add a
  // new site.
  //
  // NOTE(ericv): There are actually two reasonable algorithms, which we call
  // "snap first" (the one above) and "snap last".  The latter checks for each
  // input vertex whether any existing site is closer than snap_radius(), and
  // only then applies the snap_function() and adds a new site.  "Snap last"
  // can yield slightly fewer sites in some cases, but it is also more
  // expensive and can produce surprising results.  For example, if you snap
  // the polyline "0:0, 0:0.7" using IntLatLngSnapFunction(0), the result is
  // "0:0, 0:0" rather than the expected "0:0, 0:1", because the snap radius
  // is approximately sqrt(2) degrees and therefore it is legal to snap both
  // input points to "0:0".  "Snap first" produces "0:0, 0:1" as expected.
  for (const InputVertexKey& key : SortInputVertices()) {
    const S2Point& vertex = input_vertices_[key.second];
    S2Point site = SnapSite(vertex);
    // If any vertex moves when snapped, the output cannot be idempotent.
    snapping_needed_ = snapping_needed_ || site != vertex;

    // FindClosestPoints() measures distances conservatively, so we need to
    // recheck the distances using exact predicates.
    //
    // NOTE(ericv): When the snap radius is large compared to the average
    // vertex spacing, we could possibly avoid the call the FindClosestPoints
    // by checking whether sites_.back() is close enough.
    S2ClosestPointQueryPointTarget target(site);
    site_query.FindClosestPoints(&target, &results);
    bool add_site = true;
    for (const auto& result : results) {
      if (s2pred::CompareDistance(site, result.point(),
                                  min_site_separation_ca_) <= 0) {
        add_site = false;
        // This pair of sites is too close.  If the sites are distinct, then
        // the output cannot be idempotent.
        snapping_needed_ = snapping_needed_ || site != result.point();
      }
    }
    if (add_site) {
      site_index->Add(site, sites_.size());
      sites_.push_back(site);
      site_query.ReInit();
    }
  }
}